

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

string * __thiscall
cmMakefileTargetGenerator::GetFrameworkFlags
          (string *__return_storage_ptr__,cmMakefileTargetGenerator *this,string *l)

{
  cmMakefile *pcVar1;
  cmGeneratorTarget *target;
  cmLocalUnixMakefileGenerator3 *this_00;
  cmTarget *this_01;
  bool bVar2;
  char *pcVar3;
  cmComputeLinkInformation *this_02;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar4;
  pointer pbVar5;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar6;
  allocator local_109;
  string frameworkDir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emitted;
  string fwSearchFlagVar;
  string local_70;
  string local_50;
  
  pcVar1 = this->Makefile;
  std::__cxx11::string::string((string *)&emitted,"APPLE",(allocator *)&fwSearchFlagVar);
  bVar2 = cmMakefile::IsOn(pcVar1,(string *)&emitted);
  std::__cxx11::string::~string((string *)&emitted);
  if (bVar2) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&emitted,
                   "CMAKE_",l);
    std::operator+(&fwSearchFlagVar,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&emitted,
                   "_FRAMEWORK_SEARCH_FLAG");
    std::__cxx11::string::~string((string *)&emitted);
    pcVar3 = cmMakefile::GetDefinition(this->Makefile,&fwSearchFlagVar);
    if ((pcVar3 == (char *)0x0) || (*pcVar3 == '\0')) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    }
    else {
      emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &emitted._M_t._M_impl.super__Rb_tree_header._M_header;
      emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      emitted._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      includes.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      includes.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      includes.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pcVar1 = this->Makefile;
      emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      std::__cxx11::string::string
                ((string *)&frameworkDir,"CMAKE_BUILD_TYPE",(allocator *)&local_70);
      pcVar3 = cmMakefile::GetSafeDefinition(pcVar1,&frameworkDir);
      std::__cxx11::string::string((string *)&local_50,pcVar3,&local_109);
      std::__cxx11::string::~string((string *)&frameworkDir);
      target = this->GeneratorTarget;
      this_00 = this->LocalGenerator;
      std::__cxx11::string::string((string *)&frameworkDir,"C",(allocator *)&local_70);
      cmLocalGenerator::GetIncludeDirectories
                (&this_00->super_cmLocalGenerator,&includes,target,&frameworkDir,&local_50,true);
      std::__cxx11::string::~string((string *)&frameworkDir);
      for (pbVar5 = includes.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar5 != includes.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pbVar5 = pbVar5 + 1) {
        bVar2 = cmTarget::NameResolvesToFramework(this->Target,pbVar5);
        if (bVar2) {
          std::__cxx11::string::string((string *)&frameworkDir,(string *)pbVar5);
          std::__cxx11::string::append((char *)&frameworkDir);
          cmsys::SystemTools::CollapseFullPath(&local_70,&frameworkDir);
          std::__cxx11::string::operator=((string *)&frameworkDir,(string *)&local_70);
          std::__cxx11::string::~string((string *)&local_70);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&emitted,&frameworkDir);
          std::__cxx11::string::~string((string *)&frameworkDir);
        }
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      this_01 = this->Target;
      std::__cxx11::string::string
                ((string *)&frameworkDir,(this->LocalGenerator->ConfigurationName)._M_dataplus._M_p,
                 (allocator *)&local_70);
      this_02 = cmTarget::GetLinkInformation(this_01,&frameworkDir);
      std::__cxx11::string::~string((string *)&frameworkDir);
      if (this_02 != (cmComputeLinkInformation *)0x0) {
        pvVar4 = cmComputeLinkInformation::GetFrameworkPaths_abi_cxx11_(this_02);
        for (pbVar5 = (pvVar4->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            pbVar5 != (pvVar4->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish; pbVar5 = pbVar5 + 1) {
          pVar6 = std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string_const&>
                            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              *)&emitted,pbVar5);
          if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            std::__cxx11::string::append((char *)__return_storage_ptr__);
            cmOutputConverter::ConvertToOutputFormat
                      (&frameworkDir,
                       &(this->LocalGenerator->super_cmLocalGenerator).super_cmOutputConverter,
                       pbVar5,SHELL);
            std::__cxx11::string::append((string *)__return_storage_ptr__);
            std::__cxx11::string::~string((string *)&frameworkDir);
            std::__cxx11::string::append((char *)__return_storage_ptr__);
          }
        }
      }
      std::__cxx11::string::~string((string *)&local_50);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&includes);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&emitted._M_t);
    }
    std::__cxx11::string::~string((string *)&fwSearchFlagVar);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmMakefileTargetGenerator::GetFrameworkFlags(std::string const& l)
{
 if(!this->Makefile->IsOn("APPLE"))
   {
   return std::string();
   }

  std::string fwSearchFlagVar = "CMAKE_" + l + "_FRAMEWORK_SEARCH_FLAG";
  const char* fwSearchFlag =
    this->Makefile->GetDefinition(fwSearchFlagVar);
  if(!(fwSearchFlag && *fwSearchFlag))
    {
    return std::string();
    }

 std::set<std::string> emitted;
#ifdef __APPLE__  /* don't insert this when crosscompiling e.g. to iphone */
  emitted.insert("/System/Library/Frameworks");
#endif
  std::vector<std::string> includes;

  const std::string& config =
    this->Makefile->GetSafeDefinition("CMAKE_BUILD_TYPE");
  this->LocalGenerator->GetIncludeDirectories(includes,
                                              this->GeneratorTarget,
                                              "C", config);
  // check all include directories for frameworks as this
  // will already have added a -F for the framework
  for(std::vector<std::string>::iterator i = includes.begin();
      i != includes.end(); ++i)
    {
    if(this->Target->NameResolvesToFramework(*i))
      {
      std::string frameworkDir = *i;
      frameworkDir += "/../";
      frameworkDir = cmSystemTools::CollapseFullPath(frameworkDir);
      emitted.insert(frameworkDir);
      }
    }

  std::string flags;
  const char* cfg = this->LocalGenerator->ConfigurationName.c_str();
  if(cmComputeLinkInformation* cli = this->Target->GetLinkInformation(cfg))
    {
    std::vector<std::string> const& frameworks = cli->GetFrameworkPaths();
    for(std::vector<std::string>::const_iterator i = frameworks.begin();
        i != frameworks.end(); ++i)
      {
      if(emitted.insert(*i).second)
        {
        flags += fwSearchFlag;
        flags += this->LocalGenerator
                     ->ConvertToOutputFormat(*i, cmLocalGenerator::SHELL);
        flags += " ";
        }
      }
    }
  return flags;
}